

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O2

double __thiscall
soplex::SPxBasisBase<double>::condition(SPxBasisBase<double> *this,int maxiters,double tolerance)

{
  int p_dim;
  long lVar1;
  uint uVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  SSVectorBase<double> x;
  SSVectorBase<double> y;
  double local_110;
  double local_100;
  SSVectorBase<double> local_f0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_a0;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_90;
  SSVectorBase<double> local_80;
  
  p_dim = (this->matrix).thesize;
  lVar4 = (long)p_dim;
  if (lVar4 < 1) {
    local_110 = 1.0;
  }
  else {
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_90,
               &(this->theLP->super_SPxLPBase<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<double>::SSVectorBase(&local_f0,p_dim,(shared_ptr<soplex::Tolerances> *)&local_90);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_90._M_refcount);
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_a0,
               &(this->theLP->super_SPxLPBase<double>)._tolerances.
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    SSVectorBase<double>::SSVectorBase(&local_80,p_dim,(shared_ptr<soplex::Tolerances> *)&local_a0);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0._M_refcount);
    if (this->thestatus < REGULAR) {
      local_110 = 0.0;
    }
    else {
      if (this->matrixIsSetup == false) {
        (*this->_vptr_SPxBasisBase[5])(this,&this->thedesc);
      }
      if (this->factorized == false) {
        (*this->_vptr_SPxBasisBase[0xb])(this);
      }
      local_100 = 1.0 / (double)p_dim;
      for (lVar1 = 0; lVar4 != lVar1; lVar1 = lVar1 + 1) {
        lVar3 = (long)local_f0.super_IdxSet.num;
        local_f0.super_IdxSet.num = local_f0.super_IdxSet.num + 1;
        local_f0.super_IdxSet.idx[lVar3] = (int)lVar1;
        local_f0.super_VectorBase<double>.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar1] = local_100;
      }
      SSVectorBase<double>::operator=(&local_80,&local_f0);
      uVar2 = 0;
      if (maxiters < 1) {
        maxiters = 0;
      }
      dVar5 = local_100;
      for (; local_110 = dVar5, maxiters != uVar2; uVar2 = uVar2 + 1) {
        multBaseWith(this,&local_f0,&local_80);
        local_110 = SSVectorBase<double>::length(&local_80);
        if ((2 < uVar2) && (ABS(local_110 - dVar5) < local_110 * tolerance)) break;
        multWithBase(this,&local_80,&local_f0);
        dVar5 = SSVectorBase<double>::length(&local_f0);
        SSVectorBase<double>::operator*=(&local_f0,1.0 / dVar5);
        dVar5 = local_110;
      }
      SSVectorBase<double>::clear(&local_f0);
      SSVectorBase<double>::clear(&local_80);
      for (lVar1 = 0; lVar4 != lVar1; lVar1 = lVar1 + 1) {
        lVar3 = (long)local_f0.super_IdxSet.num;
        local_f0.super_IdxSet.num = local_f0.super_IdxSet.num + 1;
        local_f0.super_IdxSet.idx[lVar3] = (int)lVar1;
        local_f0.super_VectorBase<double>.val.super__Vector_base<double,_std::allocator<double>_>.
        _M_impl.super__Vector_impl_data._M_start[lVar1] = local_100;
      }
      SSVectorBase<double>::operator=(&local_80,&local_f0);
      for (uVar2 = 0; maxiters != uVar2; uVar2 = uVar2 + 1) {
        (*this->factor->_vptr_SLinSolver[0xd])(this->factor,&local_f0,&local_80);
        SSVectorBase<double>::setup(&local_f0);
        dVar5 = SSVectorBase<double>::length(&local_f0);
        if ((2 < uVar2) &&
           (dVar6 = dVar5 - local_100, local_100 = dVar5, ABS(dVar6) < dVar5 * tolerance)) break;
        (*this->factor->_vptr_SLinSolver[0x15])(this->factor,&local_80,&local_f0);
        SSVectorBase<double>::setup(&local_80);
        dVar6 = SSVectorBase<double>::length(&local_80);
        SSVectorBase<double>::operator*=(&local_80,1.0 / dVar6);
        local_100 = dVar5;
      }
      local_110 = local_110 * local_100;
    }
    SSVectorBase<double>::~SSVectorBase(&local_80);
    SSVectorBase<double>::~SSVectorBase(&local_f0);
  }
  return local_110;
}

Assistant:

R SPxBasisBase<R>::condition(int maxiters, R tolerance)
{
   int dimension = matrix.size();
   int miniters = 3;    // minimum number of power method iterations
   int i;
   int c;
   R norm;
   R norminv;
   R norm1;
   R norm2;

   // catch corner case of empty matrix
   if(dimension <= 0)
      return 1.0;

   SSVectorBase<R> x(dimension, theLP->tolerances());
   SSVectorBase<R> y(dimension, theLP->tolerances());

   // check whether a regular basis matrix is available
   if(status() < REGULAR)
      return 0;

   if(!matrixIsSetup)
      (const_cast<SPxBasisBase<R>*>(this))->loadDesc(thedesc);

   if(!factorized)
      factorize();

   // initialize vectors
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
   {
      // coverity[forward_null]
      x.add(i, norm1);
   }

   y = x;

   // compute norm of B
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // y = B*x
      multBaseWith(x, y);
      norm1 = y.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // x = B^T*y and normalize
      multWithBase(y, x);
      norm2 = 1.0 / x.length();
      x *= norm2;
   }

   norm = norm1;

   // reinitialize vectors
   x.clear();
   y.clear();
   norm1 = 1.0 / (R) dimension;

   for(i = 0; i < dimension; i++)
      x.add(i, norm1);

   y = x;

   // compute norm of B^-1
   for(c = 0; c < maxiters; ++c)
   {
      norm2 = norm1;

      // x = B^-1*y
      factor->solveRight(x, y);
      x.setup();
      norm1 = x.length();

      // stop if converged
      if(c >= miniters && spxAbs(norm1 - norm2) < tolerance * norm1)
         break;

      // y = B^-T*x and normalize
      factor->solveLeft(y, x);
      y.setup();
      norm2 = 1.0 / y.length();
      y *= norm2;
   }

   norminv = norm1;

   return norm * norminv;
}